

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 FastJsonEncode(jx9_value *pValue,SyBlob *pOut,int iNest)

{
  jx9_hashmap *pMap_00;
  sxi32 sVar1;
  jx9_hashmap_node *pjVar2;
  uint local_a4;
  undefined1 local_a0 [8];
  jx9_value sKey;
  jx9_value *pEntry;
  jx9_hashmap_node *pNode;
  jx9_hashmap *pMap;
  uchar *zBlob;
  sxu32 iOfft;
  uchar zBuf_1 [8];
  uchar zBuf [4];
  int c;
  sxi32 rc;
  sxi32 iType;
  int iNest_local;
  SyBlob *pOut_local;
  jx9_value *pValue_local;
  
  if (pValue == (jx9_value *)0x0) {
    local_a4 = 0x20;
  }
  else {
    local_a4 = pValue->iFlags;
  }
  zBuf[0] = '\0';
  zBuf[1] = '\0';
  zBuf[2] = '\0';
  zBuf[3] = '\0';
  if (iNest < 0x40) {
    if ((local_a4 & 0x120) == 0) {
      if ((local_a4 & 8) == 0) {
        if ((local_a4 & 1) == 0) {
          if ((local_a4 & 2) == 0) {
            if ((local_a4 & 4) == 0) {
              if ((local_a4 & 0x40) != 0) {
                pMap_00 = (jx9_hashmap *)(pValue->x).pOther;
                jx9HashmapResetLoopCursor(pMap_00);
                if ((pMap_00->iFlags & 1U) == 0) {
                  zBuf_1[4] = '\x03';
                  zBuf_1[5] = '\0';
                  zBuf_1[6] = '\0';
                  zBuf_1[7] = '\0';
                  zBuf = (uchar  [4])SyBlobAppend(pOut,zBuf_1 + 4,1);
                  if (zBuf == (uchar  [4])0x0) {
                    do {
                      pjVar2 = jx9HashmapGetNextEntry(pMap_00);
                      if (pjVar2 == (jx9_hashmap_node *)0x0) break;
                      sKey._56_8_ = jx9HashmapGetNodeValue(pjVar2);
                      zBuf = (uchar  [4])FastJsonEncode((jx9_value *)sKey._56_8_,pOut,iNest + 1);
                      if (zBuf != (uchar  [4])0x0) break;
                      zBuf_1[4] = '\x06';
                      zBuf_1[5] = '\0';
                      zBuf_1[6] = '\0';
                      zBuf_1[7] = '\0';
                      zBuf = (uchar  [4])SyBlobAppend(pOut,zBuf_1 + 4,1);
                    } while (zBuf == (uchar  [4])0x0);
                    if (zBuf == (uchar  [4])0x0) {
                      zBuf_1[4] = '\x04';
                      zBuf_1[5] = '\0';
                      zBuf_1[6] = '\0';
                      zBuf_1[7] = '\0';
                      zBuf = (uchar  [4])SyBlobAppend(pOut,zBuf_1 + 4,1);
                    }
                  }
                }
                else {
                  zBuf_1[4] = '\x01';
                  zBuf_1[5] = '\0';
                  zBuf_1[6] = '\0';
                  zBuf_1[7] = '\0';
                  zBuf = (uchar  [4])SyBlobAppend(pOut,zBuf_1 + 4,1);
                  if (zBuf == (uchar  [4])0x0) {
                    jx9MemObjInit(pMap_00->pVm,(jx9_value *)local_a0);
                    do {
                      pjVar2 = jx9HashmapGetNextEntry(pMap_00);
                      if (pjVar2 == (jx9_hashmap_node *)0x0) break;
                      jx9HashmapExtractNodeKey(pjVar2,(jx9_value *)local_a0);
                      zBuf = (uchar  [4])FastJsonEncode((jx9_value *)local_a0,pOut,iNest + 1);
                      if (zBuf != (uchar  [4])0x0) break;
                      zBuf_1[4] = '\x05';
                      zBuf_1[5] = '\0';
                      zBuf_1[6] = '\0';
                      zBuf_1[7] = '\0';
                      zBuf = (uchar  [4])SyBlobAppend(pOut,zBuf_1 + 4,1);
                      if (zBuf != (uchar  [4])0x0) break;
                      sKey._56_8_ = jx9HashmapGetNodeValue(pjVar2);
                      zBuf = (uchar  [4])FastJsonEncode((jx9_value *)sKey._56_8_,pOut,iNest + 1);
                      if (zBuf != (uchar  [4])0x0) break;
                      zBuf_1[4] = '\x06';
                      zBuf_1[5] = '\0';
                      zBuf_1[6] = '\0';
                      zBuf_1[7] = '\0';
                      zBuf = (uchar  [4])SyBlobAppend(pOut,zBuf_1 + 4,1);
                    } while (zBuf == (uchar  [4])0x0);
                    jx9MemObjRelease((jx9_value *)local_a0);
                    if (zBuf == (uchar  [4])0x0) {
                      zBuf_1[4] = '\x02';
                      zBuf_1[5] = '\0';
                      zBuf_1[6] = '\0';
                      zBuf_1[7] = '\0';
                      zBuf = (uchar  [4])SyBlobAppend(pOut,zBuf_1 + 4,1);
                    }
                  }
                }
              }
            }
            else {
              zBuf_1[4] = '\x12';
              zBuf_1[5] = '\0';
              zBuf_1[6] = '\0';
              zBuf_1[7] = '\0';
              zBuf = (uchar  [4])SyBlobAppend(pOut,zBuf_1 + 4,1);
              if (zBuf == (uchar  [4])0x0) {
                zBlob._0_4_ = pOut->nByte;
                zBuf = (uchar  [4])SyBlobAppendBig16(pOut,0);
                if (zBuf == (uchar  [4])0x0) {
                  SyBlobFormat(pOut,"%.15g",(pValue->x).rVal);
                  SyBigEndianPack16((uchar *)((long)pOut->pBlob + (ulong)(sxu32)zBlob),
                                    (short)pOut->nByte - ((short)(sxu32)zBlob + 2));
                }
              }
            }
          }
          else {
            zBuf_1[4] = '\n';
            zBuf_1[5] = '\0';
            zBuf_1[6] = '\0';
            zBuf_1[7] = '\0';
            zBuf = (uchar  [4])SyBlobAppend(pOut,zBuf_1 + 4,1);
            if (zBuf == (uchar  [4])0x0) {
              SyBigEndianPack64((uchar *)((long)&zBlob + 4),(pValue->x).iVal);
              zBuf = (uchar  [4])SyBlobAppend(pOut,(void *)((long)&zBlob + 4),8);
            }
          }
        }
        else {
          zBuf_1[4] = '\b';
          zBuf_1[5] = '\0';
          zBuf_1[6] = '\0';
          zBuf_1[7] = '\0';
          SyBigEndianPack32(zBuf_1,(pValue->sBlob).nByte);
          zBuf = (uchar  [4])SyBlobAppend(pOut,zBuf_1 + 4,1);
          if ((zBuf == (uchar  [4])0x0) &&
             (zBuf = (uchar  [4])SyBlobAppend(pOut,zBuf_1,4), zBuf == (uchar  [4])0x0)) {
            zBuf = (uchar  [4])SyBlobAppend(pOut,(pValue->sBlob).pBlob,(pValue->sBlob).nByte);
          }
        }
      }
      else {
        zBuf_1[4] = '\x19';
        zBuf_1[5] = '\0';
        zBuf_1[6] = '\0';
        zBuf_1[7] = '\0';
        if ((pValue->x).iVal != 0) {
          zBuf_1[4] = '\x18';
          zBuf_1[5] = '\0';
          zBuf_1[6] = '\0';
          zBuf_1[7] = '\0';
        }
        zBuf = (uchar  [4])SyBlobAppend(pOut,zBuf_1 + 4,1);
      }
    }
    else {
      zBuf_1[4] = '\x17';
      zBuf_1[5] = '\0';
      zBuf_1[6] = '\0';
      zBuf_1[7] = '\0';
      zBuf = (uchar  [4])SyBlobAppend(pOut,zBuf_1 + 4,1);
    }
    pValue_local._4_1_ = zBuf[0];
    pValue_local._5_1_ = zBuf[1];
    pValue_local._6_1_ = zBuf[2];
    pValue_local._7_1_ = zBuf[3];
  }
  else {
    pValue_local._4_1_ = 0xf9;
    pValue_local._5_1_ = 0xff;
    pValue_local._6_1_ = 0xff;
    pValue_local._7_1_ = 0xff;
  }
  sVar1._0_1_ = pValue_local._4_1_;
  sVar1._1_1_ = pValue_local._5_1_;
  sVar1._2_1_ = pValue_local._6_1_;
  sVar1._3_1_ = pValue_local._7_1_;
  return sVar1;
}

Assistant:

UNQLITE_PRIVATE sxi32 FastJsonEncode(
	jx9_value *pValue, /* Value to encode */
	SyBlob *pOut,      /* Store encoded value here */
	int iNest          /* Nesting limit */ 
	)
{
	sxi32 iType = pValue ? pValue->iFlags : MEMOBJ_NULL;
	sxi32 rc = SXRET_OK;
	int c;
	if( iNest >= UNQLITE_FAST_JSON_NEST_LIMIT ){
		/* Nesting limit reached */
		return SXERR_LIMIT;
	}
	if( iType & (MEMOBJ_NULL|MEMOBJ_RES) ){
		/*
		 * Resources are encoded as null also.
		 */
		c = FJSON_NULL;
		rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
	}else if( iType & MEMOBJ_BOOL ){
		c = pValue->x.iVal ? FJSON_TRUE : FJSON_FALSE;
		rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
	}else if( iType & MEMOBJ_STRING ){
		unsigned char zBuf[sizeof(sxu32)]; /* String length */
		c = FJSON_STRING;
		SyBigEndianPack32(zBuf,SyBlobLength(&pValue->sBlob));
		rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
		if( rc == SXRET_OK ){
			rc = SyBlobAppend(pOut,(const void *)zBuf,sizeof(zBuf));
			if( rc == SXRET_OK ){
				rc = SyBlobAppend(pOut,SyBlobData(&pValue->sBlob),SyBlobLength(&pValue->sBlob));
			}
		}
	}else if( iType & MEMOBJ_INT ){
		unsigned char zBuf[8];
		/* 64bit big endian integer */
		c = FJSON_INT64;
		rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
		if( rc == SXRET_OK ){
			SyBigEndianPack64(zBuf,(sxu64)pValue->x.iVal);
			rc = SyBlobAppend(pOut,(const void *)zBuf,sizeof(zBuf));
		}
	}else if( iType & MEMOBJ_REAL ){
		/* Real number */
		c = FJSON_REAL;
		rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
		if( rc == SXRET_OK ){
			sxu32 iOfft = SyBlobLength(pOut);
			rc = SyBlobAppendBig16(pOut,0);
			if( rc == SXRET_OK ){
				unsigned char *zBlob;
				SyBlobFormat(pOut,"%.15g",pValue->x.rVal);
				zBlob = (unsigned char *)SyBlobDataAt(pOut,iOfft);
				SyBigEndianPack16(zBlob,(sxu16)(SyBlobLength(pOut) - ( 2 + iOfft)));
			}
		}
	}else if( iType & MEMOBJ_HASHMAP ){
		/* A JSON object or array */
		jx9_hashmap *pMap = (jx9_hashmap *)pValue->x.pOther;
		jx9_hashmap_node *pNode;
		jx9_value *pEntry;
		/* Reset the hashmap loop cursor */
		jx9HashmapResetLoopCursor(pMap);
		if( pMap->iFlags & HASHMAP_JSON_OBJECT ){
			jx9_value sKey;
			/* A JSON object */
			c = FJSON_DOC_START; /* { */
			rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
			if( rc == SXRET_OK ){
				jx9MemObjInit(pMap->pVm,&sKey);
				/* Encode object entries */
				while((pNode = jx9HashmapGetNextEntry(pMap)) != 0 ){
					/* Extract the key */
					jx9HashmapExtractNodeKey(pNode,&sKey);
					/* Encode it */
					rc = FastJsonEncode(&sKey,pOut,iNest+1);
					if( rc != SXRET_OK ){
						break;
					}
					c = FJSON_COLON;
					rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
					if( rc != SXRET_OK ){
						break;
					}
					/* Extract the value */
					pEntry = jx9HashmapGetNodeValue(pNode);
					/* Encode it */
					rc = FastJsonEncode(pEntry,pOut,iNest+1);
					if( rc != SXRET_OK ){
						break;
					}
					/* Delimit the entry */
					c = FJSON_COMMA;
					rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
					if( rc != SXRET_OK ){
						break;
					}
				}
				jx9MemObjRelease(&sKey);
				if( rc == SXRET_OK ){
					c = FJSON_DOC_END; /* } */
					rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
				}
			}
		}else{
			/* A JSON array */
			c = FJSON_ARRAY_START; /* [ */
			rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
			if( rc == SXRET_OK ){
				/* Encode array entries */
				while( (pNode = jx9HashmapGetNextEntry(pMap)) != 0 ){
					/* Extract the value */
					pEntry = jx9HashmapGetNodeValue(pNode);
					/* Encode it */
					rc = FastJsonEncode(pEntry,pOut,iNest+1);
					if( rc != SXRET_OK ){
						break;
					}
					/* Delimit the entry */
					c = FJSON_COMMA;
					rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
					if( rc != SXRET_OK ){
						break;
					}
				}
				if( rc == SXRET_OK ){
					c = FJSON_ARRAY_END; /* ] */
					rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
				}
			}
		}
	}
	return rc;
}